

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::handle_custom_notification_resp(raft_server *this,resp_msg *resp)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  int iVar3;
  iterator iVar4;
  string local_30;
  
  if (resp->accepted_ == true) {
    local_30._M_dataplus._M_p._0_4_ = (resp->super_msg_base).src_;
    iVar4 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_30);
    if (iVar4.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar3 = (*peVar2->_vptr_logger[7])();
        if (3 < iVar3) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_30,"the response is from an unknown peer %d",
                     (ulong)(uint)(resp->super_msg_base).src_);
          (*peVar2->_vptr_logger[8])
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                     ,"handle_custom_notification_resp",0xfe,&local_30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int32)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                     (int32)local_30._M_dataplus._M_p));
          }
        }
      }
    }
    else {
      lVar1 = *(long *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                              ._M_cur + 0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x18);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        LOCK();
        *(ulong *)(lVar1 + 0x68) = resp->next_idx_;
        UNLOCK();
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        LOCK();
        *(ulong *)(lVar1 + 0x68) = resp->next_idx_;
        UNLOCK();
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_custom_notification_resp(resp_msg& resp) {
    if (!resp.get_accepted()) return;

    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }
    ptr<peer> p = it->second;

    p->set_next_log_idx(resp.get_next_idx());
}